

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_5450::TlbExportVisitor::visit_(TlbExportVisitor *this,Array *type)

{
  ostream *poVar1;
  undefined1 auVar2 [16];
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->m_stream,"<array ",7);
  indirect(this->m_stream,(Indirect *)type);
  poVar1 = this->m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," dimension=\"",0xc);
  Typelib::Array::getDimension();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\" ",2);
  (anonymous_namespace)::TlbExportVisitor::emitSourceID_abi_cxx11_
            (&local_40,(this->m_source_id)._M_dataplus._M_p);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  auVar2 = Typelib::Type::getMetaData();
  (anonymous_namespace)::TlbExportVisitor::emitMetaData_abi_cxx11_
            (&local_40,auVar2._0_8_,auVar2._8_8_);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_40._M_dataplus._M_p,local_40._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</array>",8);
  return true;
}

Assistant:

bool TlbExportVisitor::visit_ (Array const& type)
    {
        m_stream << "<array ";
        indirect(m_stream, type);
        m_stream << " dimension=\"" << type.getDimension() << "\" " << emitSourceID() << ">\n";
        m_stream << m_indent << emitMetaData(type) << "\n";
        m_stream << m_indent << "</array>";
        return true;
    }